

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWOPoints(LWOImporter *this,uint length)

{
  undefined4 uVar1;
  Layer *this_00;
  uint8_t *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  ulong uVar7;
  runtime_error *this_01;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (0x15555555 < (length * -0x55555555 >> 2 | length * -0x40000000)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"LWO2: Points chunk length is not multiple of vertexLen (12)","");
    std::runtime_error::runtime_error(this_01,(string *)local_50);
    *(undefined ***)this_01 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = this->mCurLayer;
  uVar8 = (int)((ulong)((long)(this_00->mTempPoints).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->mTempPoints).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 +
          length / 0xc;
  if (this->mIsLWO2 == true) {
    uVar7 = (ulong)((uVar8 >> 2) + uVar8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&this_00->mTempPoints,uVar7);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (&this->mCurLayer->mTempPoints,(ulong)uVar8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->mCurLayer->mPointReferrers,uVar7);
    local_50[0] = (undefined1 *)CONCAT44(local_50[0]._4_4_,0xffffffff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->mCurLayer->mPointReferrers,(ulong)uVar8,(value_type_conflict1 *)local_50);
  }
  else {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (&this_00->mTempPoints,(ulong)uVar8);
  }
  if (3 < length) {
    uVar7 = 0;
    do {
      puVar2 = this->mFileBuffer;
      if (puVar2 == (uint8_t *)0x0) {
        __assert_fail("_szOut",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/ByteSwapper.h"
                      ,0x59,"static void Assimp::ByteSwap::Swap4(void *)");
      }
      uVar1 = *(undefined4 *)(puVar2 + uVar7 * 4);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)
                                                  (byte)((uint)uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),
                                                  CONCAT12((char)((uint)uVar1 >> 8),(short)uVar1))
                                           >> 0x10),(short)uVar1) & 0xffff00ff00ff00ff;
      auVar9 = pshuflw(auVar9,auVar9,0x1b);
      sVar3 = auVar9._0_2_;
      sVar4 = auVar9._2_2_;
      sVar5 = auVar9._4_2_;
      sVar6 = auVar9._6_2_;
      *(uint *)(puVar2 + uVar7 * 4) =
           CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar9[6] - (0xff < sVar6),
                    CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar9[4] - (0xff < sVar5),
                             CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar9[2] - (0xff < sVar4),
                                      (0 < sVar3) * (sVar3 < 0x100) * auVar9[0] - (0xff < sVar3))));
      uVar7 = uVar7 + 1;
    } while (length >> 2 != uVar7);
  }
  memcpy((this->mCurLayer->mTempPoints).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_start,this->mFileBuffer,(ulong)length);
  return;
}

Assistant:

void LWOImporter::LoadLWOPoints(unsigned int length)
{
    // --- this function is used for both LWO2 and LWOB but for
    // LWO2 we need to allocate 25% more storage - it could be we'll
    // need to duplicate some points later.
    const size_t vertexLen = 12;
    if ((length % vertexLen) != 0)
    {
        throw DeadlyImportError( "LWO2: Points chunk length is not multiple of vertexLen (12)");
    }
    unsigned int regularSize = (unsigned int)mCurLayer->mTempPoints.size() + length / 12;
    if (mIsLWO2)
    {
        mCurLayer->mTempPoints.reserve  ( regularSize + (regularSize>>2u) );
        mCurLayer->mTempPoints.resize   ( regularSize );

        // initialize all point referrers with the default values
        mCurLayer->mPointReferrers.reserve  ( regularSize + (regularSize>>2u) );
        mCurLayer->mPointReferrers.resize   ( regularSize, UINT_MAX );
    }
    else mCurLayer->mTempPoints.resize( regularSize );

    // perform endianness conversions
#ifndef AI_BUILD_BIG_ENDIAN
    for (unsigned int i = 0; i < length>>2;++i)
        ByteSwap::Swap4( mFileBuffer + (i << 2));
#endif
    ::memcpy(&mCurLayer->mTempPoints[0],mFileBuffer,length);
}